

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Nsf_Emu.cpp
# Opt level: O0

void __thiscall Nsf_Emu::update_eq(Nsf_Emu *this,blip_eq_t *eq)

{
  Nes_Apu *in_RSI;
  blip_eq_t *in_RDI;
  
  Nes_Apu::treble_eq(in_RSI,in_RDI);
  if (in_RDI[0x5a].cutoff_freq != 0) {
    Nes_Namco_Apu::treble_eq((Nes_Namco_Apu *)in_RSI,in_RDI);
  }
  if (in_RDI[0x5b].treble != 0.0) {
    Nes_Vrc6_Apu::treble_eq((Nes_Vrc6_Apu *)in_RSI,in_RDI);
  }
  if (in_RDI[0x5b].rolloff_freq != 0) {
    Nes_Fme7_Apu::treble_eq((Nes_Fme7_Apu *)in_RSI,in_RDI);
  }
  return;
}

Assistant:

void Nsf_Emu::update_eq( blip_eq_t const& eq )
{
	apu.treble_eq( eq );
	
	#if !NSF_EMU_APU_ONLY
	{
		if ( namco ) namco->treble_eq( eq );
		if ( vrc6  ) vrc6 ->treble_eq( eq );
		if ( fme7  ) fme7 ->treble_eq( eq );
	}
	#endif
}